

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
::
SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,void>
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
           *this,VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>
                 *Object,Uint64 QueueMask)

{
  ulong uVar1;
  ulong uVar2;
  char (*Args_1) [27];
  ulong uVar3;
  string msg;
  DynamicStaleResourceWrapper Wrapper;
  
  if (*(long *)(this + 0x1c48) == 0) {
    FormatString<char[99]>
              (&msg,(char (*) [99])
                    "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar3 = ~(-1L << ((byte)*(ulong *)(this + 0x1c40) & 0x3f));
  if (0x3f < *(ulong *)(this + 0x1c40)) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar3 = uVar3 & QueueMask;
  if (uVar3 == 0) {
    FormatString<char[57]>
              (&msg,(char (*) [57])"At least one bit should be set in the command queue mask");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    uVar2 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
    uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
    Args_1 = (char (*) [27])((uVar2 >> 4) + uVar2);
    uVar2 = ((ulong)Args_1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    DynamicStaleResourceWrapper::
    Create<VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,void>
              (&Wrapper,Object,uVar2);
    for (; uVar3 != 0; uVar3 = uVar3 & ~(1L << (uVar1 & 0x3f))) {
      uVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      if (*(ulong *)(this + 0x1c40) <= uVar1) {
        FormatString<char[26],char[27]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5b55cc,Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        std::__cxx11::string::~string((string *)&msg);
      }
      Args_1 = (char (*) [27])(uVar1 * 0x168);
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                 (Args_1[2] + *(long *)(this + 0x1c48) + 2),&Wrapper,
                 *(Uint64 *)(Args_1[1] + *(long *)(this + 0x1c48) + 0xd));
      uVar2 = uVar2 - 1;
    }
    if (uVar2 != 0) {
      FormatString<char[26],char[19]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NumReferences == 0",
                 (char (*) [19])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                 ,0x82);
      std::__cxx11::string::~string((string *)&msg);
    }
    Wrapper.m_pStaleResource = (StaleResourceBase *)0x0;
    DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper(&Wrapper);
  }
  return;
}

Assistant:

void SafeReleaseDeviceObject(ObjectType&& Object, Uint64 QueueMask)
    {
        VERIFY(m_CommandQueues != nullptr, "Command queues have been destroyed. Are you releasing an object from the render device destructor?");

        QueueMask &= GetCommandQueueMask();

        VERIFY(QueueMask != 0, "At least one bit should be set in the command queue mask");
        if (QueueMask == 0)
            return;

        DynamicStaleResourceWrapper::RefCounterType NumReferences = PlatformMisc::CountOneBits(QueueMask);

        auto Wrapper = DynamicStaleResourceWrapper::Create(std::move(Object), NumReferences);

        while (QueueMask != 0)
        {
            auto QueueInd = PlatformMisc::GetLSB(QueueMask);
            VERIFY_EXPR(QueueInd < m_CmdQueueCount);

            auto& Queue = m_CommandQueues[QueueInd];
            // Do not use std::move on wrapper!!!
            Queue.ReleaseQueue.SafeReleaseResource(Wrapper, Queue.NextCmdBufferNumber.load());
            QueueMask &= ~(Uint64{1} << Uint64{QueueInd});
            --NumReferences;
        }
        VERIFY_EXPR(NumReferences == 0);

        Wrapper.GiveUpOwnership();
    }